

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void bench_ellswift_setup(void *arg)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  bool bVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  char *pcVar29;
  ulong uVar30;
  undefined1 *puVar31;
  void *pvVar32;
  void *pvVar33;
  void *pvVar34;
  uint uVar35;
  undefined8 *puVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  char **argv;
  int argc;
  undefined8 *puVar40;
  undefined8 *puVar41;
  long lVar43;
  ulong uVar44;
  char **ppcVar45;
  ulong uVar46;
  size_t __size;
  undefined8 *puVar47;
  char cVar48;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  undefined1 auVar49 [16];
  char cVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  short sVar72;
  short sVar73;
  undefined1 auVar80 [16];
  short sVar81;
  short sVar82;
  undefined1 auVar87 [12];
  undefined1 auVar92 [16];
  undefined4 uVar94;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int in_stack_fffffffffffffc48;
  undefined8 auStack_390 [2];
  void *pvStack_380;
  void *pvStack_378;
  void *pvStack_370;
  void *pvStack_368;
  long lStack_360;
  undefined1 uStack_358;
  undefined1 uStack_357;
  undefined1 uStack_356;
  undefined1 uStack_355;
  undefined8 uStack_354;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined8 uStack_340;
  undefined8 uStack_330;
  char acStack_328 [32];
  undefined1 auStack_308 [32];
  undefined1 auStack_2e8 [72];
  undefined8 uStack_2a0;
  undefined1 auStack_298 [40];
  undefined8 uStack_270;
  undefined8 auStack_268 [13];
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined8 uStack_180;
  ulong uStack_178;
  ulong uStack_170;
  undefined8 *puStack_168;
  undefined8 *puStack_160;
  code *pcStack_158;
  int iStack_14c;
  undefined8 *puStack_148;
  undefined8 uStack_140;
  ulong uStack_138;
  undefined8 *puStack_130;
  undefined1 *puStack_128;
  undefined8 *puStack_120;
  undefined8 *puStack_118;
  code *pcStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  ulong uStack_c8;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  undefined8 *puStack_b0;
  code *pcStack_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [64];
  void *pvStack_58;
  long lStack_50;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined8 uVar42;
  undefined4 uVar74;
  undefined6 uVar75;
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [14];
  undefined4 uVar83;
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar93 [16];
  undefined6 uVar95;
  undefined8 uVar96;
  undefined1 auVar97 [12];
  undefined1 auVar98 [14];
  undefined1 auVar101 [16];
  
  lVar39 = (long)arg + 0x4008;
  puVar1 = (uchar *)((long)arg + 0x4038);
  puVar1[0] = 'H';
  puVar1[1] = 'Q';
  puVar1[2] = '\x1e';
  puVar1[3] = 0xd4;
  puVar1[4] = '\x16';
  puVar1[5] = 0xfd;
  puVar1[6] = 'B';
  puVar1[7] = 0x85;
  puVar1 = (uchar *)((long)arg + 0x4040);
  puVar1[0] = 'b';
  puVar1[1] = 0xc9;
  puVar1[2] = '\x02';
  puVar1[3] = 0xf9;
  puVar1[4] = 0x89;
  puVar1[5] = 0x84;
  puVar1[6] = 0xff;
  puVar1[7] = 0xdc;
  puVar1 = (uchar *)((long)arg + 0x4028);
  puVar1[0] = 0xb0;
  puVar1[1] = ',';
  puVar1[2] = 'F';
  puVar1[3] = 0xd8;
  puVar1[4] = 0xba;
  puVar1[5] = 0xca;
  puVar1[6] = '&';
  puVar1[7] = 'O';
  puVar1 = (uchar *)((long)arg + 0x4030);
  puVar1[0] = 0x8f;
  puVar1[1] = 0x8c;
  puVar1[2] = 0xd4;
  puVar1[3] = 0xdd;
  puVar1[4] = '-';
  puVar1[5] = '\x04';
  puVar1[6] = 0xbe;
  puVar1[7] = '0';
  puVar1 = (uchar *)((long)arg + 0x4018);
  puVar1[0] = '\n';
  puVar1[1] = 'd';
  puVar1[2] = 0xca;
  puVar1[3] = '2';
  puVar1[4] = 0x9e;
  puVar1[5] = 0xc6;
  puVar1[6] = ' ';
  puVar1[7] = 'y';
  puVar1 = (uchar *)((long)arg + 0x4020);
  puVar1[0] = '\x03';
  puVar1[1] = 0xf3;
  puVar1[2] = 0xd0;
  puVar1[3] = 'F';
  puVar1[4] = 'z';
  puVar1[5] = '\x0f';
  puVar1[6] = 0xd2;
  puVar1[7] = '!';
  puVar1 = (uchar *)((long)arg + 0x4008);
  puVar1[0] = 'x';
  puVar1[1] = '\x1f';
  puVar1[2] = 0xb7;
  puVar1[3] = 0xd4;
  puVar1[4] = 'g';
  puVar1[5] = '\x7f';
  puVar1[6] = '\b';
  puVar1[7] = 'h';
  puVar1 = (uchar *)((long)arg + 0x4010);
  puVar1[0] = 0xdb;
  puVar1[1] = 0xe3;
  puVar1[2] = '\x1d';
  puVar1[3] = '\x7f';
  puVar1[4] = '\x1b';
  puVar1[5] = 0xb0;
  puVar1[6] = 0xf6;
  puVar1[7] = 0x9e;
  lVar43 = 0;
  do {
    puVar40 = *arg;
    lVar38 = (long)arg + lVar43 * 0x40 + 8;
    iVar26 = secp256k1_ellswift_decode(puVar40,lVar38,lVar39);
    uVar37 = (uint)lVar38;
    if (iVar26 == 0) {
      bench_ellswift_setup_cold_2();
      goto LAB_00102e37;
    }
    lVar38 = 0x4008;
    do {
      pcVar29 = (char *)((long)arg + lVar38);
      cVar48 = pcVar29[1];
      cVar50 = pcVar29[2];
      cVar51 = pcVar29[3];
      cVar52 = pcVar29[4];
      cVar53 = pcVar29[5];
      cVar54 = pcVar29[6];
      cVar55 = pcVar29[7];
      cVar56 = pcVar29[8];
      cVar57 = pcVar29[9];
      cVar58 = pcVar29[10];
      cVar59 = pcVar29[0xb];
      cVar60 = pcVar29[0xc];
      cVar61 = pcVar29[0xd];
      cVar62 = pcVar29[0xe];
      cVar63 = pcVar29[0xf];
      pcVar4 = (char *)((long)arg + lVar38);
      *pcVar4 = *pcVar29 + '\x01';
      pcVar4[1] = cVar48 + '\x01';
      pcVar4[2] = cVar50 + '\x01';
      pcVar4[3] = cVar51 + '\x01';
      pcVar4[4] = cVar52 + '\x01';
      pcVar4[5] = cVar53 + '\x01';
      pcVar4[6] = cVar54 + '\x01';
      pcVar4[7] = cVar55 + '\x01';
      pcVar4[8] = cVar56 + '\x01';
      pcVar4[9] = cVar57 + '\x01';
      pcVar4[10] = cVar58 + '\x01';
      pcVar4[0xb] = cVar59 + '\x01';
      pcVar4[0xc] = cVar60 + '\x01';
      pcVar4[0xd] = cVar61 + '\x01';
      pcVar4[0xe] = cVar62 + '\x01';
      pcVar4[0xf] = cVar63 + '\x01';
      lVar38 = lVar38 + 0x10;
    } while (lVar38 != 0x4048);
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0x100);
  puVar40 = *arg;
  arg = (void *)((long)arg + 0x3fc8);
  iVar26 = secp256k1_ellswift_encode(puVar40,lVar39,arg,bench_ellswift_setup::init + 0x10);
  uVar37 = (uint)lVar39;
  if (iVar26 != 0) {
    return;
  }
LAB_00102e37:
  bench_ellswift_setup_cold_1();
  if ((int)uVar37 < 1) {
    return;
  }
  puVar2 = puVar40 + 0x801;
  uVar30 = 0;
  pvStack_58 = arg;
  lStack_50 = lVar43;
  while( true ) {
    puVar41 = (undefined8 *)*puVar40;
    pcStack_a8 = (code *)0x102e72;
    puVar31 = auStack_98;
    iVar26 = secp256k1_ellswift_decode(puVar41,auStack_98,puVar2);
    uVar35 = (uint)puVar31;
    if (iVar26 != 1) break;
    uStack_a0 = 0x21;
    puVar41 = (undefined8 *)*puVar40;
    lVar39 = (ulong)((uint)uVar30 & 0x1f) + (long)puVar2;
    pcStack_a8 = (code *)0x102e9b;
    iVar26 = secp256k1_ec_pubkey_serialize(puVar41,lVar39,&uStack_a0,auStack_98,0x102);
    uVar35 = (uint)lVar39;
    if (iVar26 == 0) goto LAB_00102eb9;
    uVar35 = (uint)uVar30 + 1;
    uVar30 = (ulong)uVar35;
    if (uVar37 == uVar35) {
      return;
    }
  }
  pcStack_a8 = (code *)0x102eb9;
  bench_ellswift_decode_cold_1();
LAB_00102eb9:
  pcStack_a8 = bench_ellswift_create;
  bench_ellswift_decode_cold_2();
  if ((int)uVar35 < 1) {
    return;
  }
  puVar3 = puVar41 + 0x801;
  uStack_c8 = (ulong)uVar37;
  puStack_c0 = auStack_98;
  puStack_b8 = (undefined1 *)&uStack_a0;
  puStack_b0 = puVar40;
  pcStack_a8 = (code *)puVar2;
  while( true ) {
    puVar40 = (undefined8 *)*puVar41;
    pcStack_110 = (code *)0x102ef6;
    iStack_14c = (int)&uStack_108;
    iVar26 = secp256k1_ellswift_create(puVar40,&uStack_108,puVar3,puVar41 + 0x805);
    if (iVar26 == 0) break;
    puVar41[0x807] = uStack_d8;
    puVar41[0x808] = uStack_d0;
    puVar41[0x805] = uStack_e8;
    puVar41[0x806] = uStack_e0;
    puVar41[0x803] = uStack_f8;
    puVar41[0x804] = uStack_f0;
    *puVar3 = uStack_108;
    puVar41[0x802] = uStack_100;
    uVar35 = uVar35 - 1;
    if (uVar35 == 0) {
      return;
    }
  }
  pcStack_110 = bench_ellswift_xdh;
  bench_ellswift_create_cold_1();
  if (iStack_14c < 1) {
    return;
  }
  puVar2 = puVar40 + 0x801;
  uStack_140 = _secp256k1_ellswift_xdh_hash_function_bip324;
  puVar36 = puVar40 + 0x803;
  uVar44 = 0x10;
  uVar46 = 0;
  puVar47 = puVar2;
  puStack_148 = puVar40;
  uStack_138 = (ulong)uVar35;
  puStack_130 = puVar41 + 0x805;
  puStack_128 = (undefined1 *)&uStack_108;
  puStack_120 = puVar41;
  puStack_118 = puVar3;
  pcStack_110 = (code *)uVar30;
  while( true ) {
    argv = (char **)((long)puVar47 + (uVar46 / 0x21) * -0x21);
    uVar42 = *puStack_148;
    pcStack_158 = (code *)0x0;
    puStack_160 = (undefined8 *)uStack_140;
    puStack_168 = (undefined8 *)0x102fe0;
    iVar26 = secp256k1_ellswift_xdh
                       (uVar42,argv,puVar2,puVar2,(long)puVar36 + (uVar44 / 0x21) * -0x21);
    argc = (int)uVar42;
    if (iVar26 != 1) break;
    uVar46 = uVar46 + 1;
    puVar36 = (undefined8 *)((long)puVar36 + 1);
    uVar44 = uVar44 + 1;
    puVar47 = (undefined8 *)((long)puVar47 + 1);
    if (iStack_14c == (int)uVar46) {
      return;
    }
  }
  pcStack_158 = main;
  bench_ellswift_xdh_cold_1();
  uStack_180 = 0xf83e0f83e0f83e1;
  uStack_178 = uVar44;
  uStack_170 = uVar46;
  puStack_168 = puVar2;
  puStack_160 = puVar47;
  pcStack_158 = (code *)puVar36;
  pcVar29 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar29 == (char *)0x0) {
    uVar30 = 20000;
  }
  else {
    uVar30 = strtol(pcVar29,(char **)0x0,0);
  }
  bVar25 = true;
  if (argc != 1) {
    ppcVar45 = argv + 1;
    do {
      pcVar29 = *ppcVar45;
      lVar39 = 0;
      while (iVar26 = strcmp(pcVar29,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar39)),
            iVar26 != 0) {
        lVar39 = lVar39 + 8;
        if (lVar39 == 0xa8) {
          bVar25 = false;
          goto LAB_001030c7;
        }
      }
      ppcVar45 = ppcVar45 + 1;
    } while (ppcVar45 != argv + argc);
    bVar25 = true;
  }
LAB_001030c7:
  lVar39 = (long)argc * 8;
  if (1 < argc) {
    lVar43 = 8;
    do {
      lVar38 = lVar43;
      if (lVar39 - lVar38 == 0) goto LAB_0010310a;
      pcVar29 = *(char **)((long)argv + lVar38);
      iVar26 = strcmp(pcVar29,"-h");
      iVar27 = (int)pcVar29;
      lVar43 = lVar38 + 8;
    } while (iVar26 != 0);
    if (lVar39 - lVar38 != 0) {
LAB_00103164:
      help(iVar27);
      return;
    }
LAB_0010310a:
    lVar43 = 8;
    do {
      lVar38 = lVar43;
      if (lVar39 - lVar38 == 0) goto LAB_00103137;
      pcVar29 = *(char **)((long)argv + lVar38);
      iVar26 = strcmp(pcVar29,"--help");
      iVar27 = (int)pcVar29;
      lVar43 = lVar38 + 8;
    } while (iVar26 != 0);
    if (lVar39 - lVar38 != 0) goto LAB_00103164;
LAB_00103137:
    lVar43 = 8;
    do {
      lVar38 = lVar43;
      if (lVar39 - lVar38 == 0) goto LAB_0010316e;
      pcVar29 = *(char **)((long)argv + lVar38);
      iVar26 = strcmp(pcVar29,"help");
      iVar27 = (int)pcVar29;
      lVar43 = lVar38 + 8;
    } while (iVar26 != 0);
    if (lVar39 - lVar38 != 0) goto LAB_00103164;
LAB_0010316e:
    if (!bVar25) {
      main_cold_1();
      return;
    }
  }
  lVar43 = 8;
  do {
    lVar38 = lVar43;
    if (lVar39 - lVar38 == 0) goto LAB_001031aa;
    iVar26 = strcmp(*(char **)((long)argv + lVar38),"recover");
    lVar43 = lVar38 + 8;
  } while (iVar26 != 0);
  if (lVar39 - lVar38 != 0) {
LAB_00103a45:
    main_cold_2();
    return;
  }
LAB_001031aa:
  lVar43 = 8;
  do {
    lVar38 = lVar43;
    if (lVar39 - lVar38 == 0) goto LAB_001031db;
    iVar26 = strcmp(*(char **)((long)argv + lVar38),"ecdsa_recover");
    lVar43 = lVar38 + 8;
  } while (iVar26 != 0);
  if (lVar39 - lVar38 != 0) goto LAB_00103a45;
LAB_001031db:
  uStack_330 = secp256k1_context_create(1);
  lVar43 = 8;
  auVar49 = _DAT_00105010;
  auVar65 = _DAT_00105020;
  auVar66 = _DAT_00105030;
  auVar67 = _DAT_00105040;
  auVar68 = _DAT_00105050;
  auVar69 = _DAT_00105060;
  auVar70 = _DAT_00105070;
  auVar71 = _DAT_00105080;
  do {
    auVar80 = auVar71 & _DAT_00105090;
    auVar92 = auVar70 & _DAT_00105090;
    sVar13 = auVar80._0_2_;
    cVar50 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0] - (0xff < sVar13);
    sVar13 = auVar80._2_2_;
    sVar72 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar80[2] - (0xff < sVar13),cVar50);
    sVar13 = auVar80._4_2_;
    cVar48 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[4] - (0xff < sVar13);
    sVar13 = auVar80._6_2_;
    uVar74 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar80[6] - (0xff < sVar13),
                      CONCAT12(cVar48,sVar72));
    sVar13 = auVar80._8_2_;
    cVar51 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[8] - (0xff < sVar13);
    sVar13 = auVar80._10_2_;
    uVar75 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar80[10] - (0xff < sVar13),
                      CONCAT14(cVar51,uVar74));
    sVar13 = auVar80._12_2_;
    cVar52 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0xc] - (0xff < sVar13);
    sVar13 = auVar80._14_2_;
    uVar42 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar80[0xe] - (0xff < sVar13),
                      CONCAT16(cVar52,uVar75));
    sVar13 = auVar92._0_2_;
    cVar53 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0] - (0xff < sVar13);
    sVar13 = auVar92._2_2_;
    auVar76._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar92[2] - (0xff < sVar13),
                  CONCAT18(cVar53,uVar42));
    sVar13 = auVar92._4_2_;
    cVar54 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[4] - (0xff < sVar13);
    auVar76[10] = cVar54;
    sVar13 = auVar92._6_2_;
    auVar76[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar92[6] - (0xff < sVar13);
    sVar13 = auVar92._8_2_;
    cVar55 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[8] - (0xff < sVar13);
    auVar78[0xc] = cVar55;
    auVar78._0_12_ = auVar76;
    sVar13 = auVar92._10_2_;
    auVar78[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar92[10] - (0xff < sVar13);
    sVar13 = auVar92._12_2_;
    cVar56 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0xc] - (0xff < sVar13);
    auVar80[0xe] = cVar56;
    auVar80._0_14_ = auVar78;
    sVar13 = auVar92._14_2_;
    auVar80[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0xe] - (0xff < sVar13);
    auVar92 = auVar69 & _DAT_00105090;
    auVar99 = auVar68 & _DAT_00105090;
    sVar13 = auVar92._0_2_;
    cVar57 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0] - (0xff < sVar13);
    sVar13 = auVar92._2_2_;
    sVar81 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar92[2] - (0xff < sVar13),cVar57);
    sVar13 = auVar92._4_2_;
    cVar58 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[4] - (0xff < sVar13);
    sVar13 = auVar92._6_2_;
    uVar83 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar92[6] - (0xff < sVar13),
                      CONCAT12(cVar58,sVar81));
    sVar13 = auVar92._8_2_;
    cVar59 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[8] - (0xff < sVar13);
    sVar13 = auVar92._10_2_;
    uVar84 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar92[10] - (0xff < sVar13),
                      CONCAT14(cVar59,uVar83));
    sVar13 = auVar92._12_2_;
    cVar60 = (0 < sVar13) * (sVar13 < 0x100) * auVar92[0xc] - (0xff < sVar13);
    sVar13 = auVar92._14_2_;
    uVar85 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar92[0xe] - (0xff < sVar13),
                      CONCAT16(cVar60,uVar84));
    sVar13 = auVar99._0_2_;
    cVar61 = (0 < sVar13) * (sVar13 < 0x100) * auVar99[0] - (0xff < sVar13);
    sVar13 = auVar99._2_2_;
    auVar86._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar99[2] - (0xff < sVar13),
                  CONCAT18(cVar61,uVar85));
    sVar13 = auVar99._4_2_;
    cVar62 = (0 < sVar13) * (sVar13 < 0x100) * auVar99[4] - (0xff < sVar13);
    auVar86[10] = cVar62;
    sVar13 = auVar99._6_2_;
    auVar86[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar99[6] - (0xff < sVar13);
    sVar13 = auVar99._8_2_;
    cVar63 = (0 < sVar13) * (sVar13 < 0x100) * auVar99[8] - (0xff < sVar13);
    auVar89[0xc] = cVar63;
    auVar89._0_12_ = auVar86;
    sVar13 = auVar99._10_2_;
    auVar89[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar99[10] - (0xff < sVar13);
    sVar13 = auVar99._12_2_;
    cVar64 = (0 < sVar13) * (sVar13 < 0x100) * auVar99[0xc] - (0xff < sVar13);
    auVar100[0xe] = cVar64;
    auVar100._0_14_ = auVar89;
    sVar13 = auVar99._14_2_;
    auVar100[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar99[0xe] - (0xff < sVar13);
    cVar50 = (0 < sVar72) * (sVar72 < 0x100) * cVar50 - (0xff < sVar72);
    sVar13 = (short)((uint)uVar74 >> 0x10);
    sVar73 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * cVar48 - (0xff < sVar13),cVar50);
    sVar13 = (short)((uint6)uVar75 >> 0x20);
    cVar5 = (0 < sVar13) * (sVar13 < 0x100) * cVar51 - (0xff < sVar13);
    sVar13 = (short)((ulong)uVar42 >> 0x30);
    uVar74 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar52 - (0xff < sVar13),
                      CONCAT12(cVar5,sVar73));
    sVar13 = (short)((unkuint10)auVar76._0_10_ >> 0x40);
    cVar48 = (0 < sVar13) * (sVar13 < 0x100) * cVar53 - (0xff < sVar13);
    sVar13 = auVar76._10_2_;
    uVar75 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar54 - (0xff < sVar13),
                      CONCAT14(cVar48,uVar74));
    sVar13 = auVar78._12_2_;
    cVar55 = (0 < sVar13) * (sVar13 < 0x100) * cVar55 - (0xff < sVar13);
    sVar13 = auVar80._14_2_;
    uVar42 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * cVar56 - (0xff < sVar13),
                      CONCAT16(cVar55,uVar75));
    cVar54 = (0 < sVar81) * (sVar81 < 0x100) * cVar57 - (0xff < sVar81);
    sVar13 = (short)((uint)uVar83 >> 0x10);
    auVar77._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * cVar58 - (0xff < sVar13),CONCAT18(cVar54,uVar42)
                 );
    sVar13 = (short)((uint6)uVar84 >> 0x20);
    cVar53 = (0 < sVar13) * (sVar13 < 0x100) * cVar59 - (0xff < sVar13);
    auVar77[10] = cVar53;
    sVar13 = (short)((ulong)uVar85 >> 0x30);
    auVar77[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar60 - (0xff < sVar13);
    sVar13 = (short)((unkuint10)auVar86._0_10_ >> 0x40);
    cVar52 = (0 < sVar13) * (sVar13 < 0x100) * cVar61 - (0xff < sVar13);
    auVar79[0xc] = cVar52;
    auVar79._0_12_ = auVar77;
    sVar13 = auVar86._10_2_;
    auVar79[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar62 - (0xff < sVar13);
    sVar13 = auVar89._12_2_;
    cVar51 = (0 < sVar13) * (sVar13 < 0x100) * cVar63 - (0xff < sVar13);
    auVar92[0xe] = cVar51;
    auVar92._0_14_ = auVar79;
    sVar13 = auVar100._14_2_;
    auVar92[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar64 - (0xff < sVar13);
    auVar80 = auVar67 & _DAT_00105090;
    auVar100 = auVar66 & _DAT_00105090;
    sVar13 = auVar80._0_2_;
    cVar63 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0] - (0xff < sVar13);
    sVar13 = auVar80._2_2_;
    sVar72 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar80[2] - (0xff < sVar13),cVar63);
    sVar13 = auVar80._4_2_;
    cVar62 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[4] - (0xff < sVar13);
    sVar13 = auVar80._6_2_;
    uVar83 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar80[6] - (0xff < sVar13),
                      CONCAT12(cVar62,sVar72));
    sVar13 = auVar80._8_2_;
    cVar61 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[8] - (0xff < sVar13);
    sVar13 = auVar80._10_2_;
    uVar84 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar80[10] - (0xff < sVar13),
                      CONCAT14(cVar61,uVar83));
    sVar13 = auVar80._12_2_;
    cVar60 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0xc] - (0xff < sVar13);
    sVar13 = auVar80._14_2_;
    uVar85 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar80[0xe] - (0xff < sVar13),
                      CONCAT16(cVar60,uVar84));
    sVar13 = auVar100._0_2_;
    cVar59 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0] - (0xff < sVar13);
    sVar13 = auVar100._2_2_;
    auVar87._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar100[2] - (0xff < sVar13),
                  CONCAT18(cVar59,uVar85));
    sVar13 = auVar100._4_2_;
    cVar58 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[4] - (0xff < sVar13);
    auVar87[10] = cVar58;
    sVar13 = auVar100._6_2_;
    auVar87[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[6] - (0xff < sVar13);
    sVar13 = auVar100._8_2_;
    cVar57 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[8] - (0xff < sVar13);
    auVar90[0xc] = cVar57;
    auVar90._0_12_ = auVar87;
    sVar13 = auVar100._10_2_;
    auVar90[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[10] - (0xff < sVar13);
    sVar13 = auVar100._12_2_;
    cVar56 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0xc] - (0xff < sVar13);
    auVar99[0xe] = cVar56;
    auVar99._0_14_ = auVar90;
    sVar13 = auVar100._14_2_;
    auVar99[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0xe] - (0xff < sVar13);
    auVar80 = auVar65 & _DAT_00105090;
    auVar100 = auVar49 & _DAT_00105090;
    sVar13 = auVar80._0_2_;
    cVar6 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0] - (0xff < sVar13);
    sVar13 = auVar80._2_2_;
    sVar81 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar80[2] - (0xff < sVar13),cVar6);
    sVar13 = auVar80._4_2_;
    cVar7 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[4] - (0xff < sVar13);
    sVar13 = auVar80._6_2_;
    uVar94 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar80[6] - (0xff < sVar13),
                      CONCAT12(cVar7,sVar81));
    sVar13 = auVar80._8_2_;
    cVar8 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[8] - (0xff < sVar13);
    sVar13 = auVar80._10_2_;
    uVar95 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar80[10] - (0xff < sVar13),
                      CONCAT14(cVar8,uVar94));
    sVar13 = auVar80._12_2_;
    cVar9 = (0 < sVar13) * (sVar13 < 0x100) * auVar80[0xc] - (0xff < sVar13);
    sVar13 = auVar80._14_2_;
    uVar96 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar80[0xe] - (0xff < sVar13),
                      CONCAT16(cVar9,uVar95));
    sVar13 = auVar100._0_2_;
    cVar10 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0] - (0xff < sVar13);
    sVar13 = auVar100._2_2_;
    auVar97._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar100[2] - (0xff < sVar13),
                  CONCAT18(cVar10,uVar96));
    sVar13 = auVar100._4_2_;
    cVar11 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[4] - (0xff < sVar13);
    auVar97[10] = cVar11;
    sVar13 = auVar100._6_2_;
    auVar97[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[6] - (0xff < sVar13);
    sVar13 = auVar100._8_2_;
    cVar12 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[8] - (0xff < sVar13);
    auVar98[0xc] = cVar12;
    auVar98._0_12_ = auVar97;
    sVar13 = auVar100._10_2_;
    auVar98[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[10] - (0xff < sVar13);
    sVar13 = auVar100._12_2_;
    cVar64 = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0xc] - (0xff < sVar13);
    auVar101[0xe] = cVar64;
    auVar101._0_14_ = auVar98;
    sVar13 = auVar100._14_2_;
    auVar101[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar100[0xe] - (0xff < sVar13);
    cVar63 = (0 < sVar72) * (sVar72 < 0x100) * cVar63 - (0xff < sVar72);
    sVar13 = (short)((uint)uVar83 >> 0x10);
    sVar82 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * cVar62 - (0xff < sVar13),cVar63);
    sVar13 = (short)((uint6)uVar84 >> 0x20);
    cVar61 = (0 < sVar13) * (sVar13 < 0x100) * cVar61 - (0xff < sVar13);
    sVar13 = (short)((ulong)uVar85 >> 0x30);
    uVar83 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar60 - (0xff < sVar13),
                      CONCAT12(cVar61,sVar82));
    sVar13 = (short)((unkuint10)auVar87._0_10_ >> 0x40);
    cVar60 = (0 < sVar13) * (sVar13 < 0x100) * cVar59 - (0xff < sVar13);
    sVar13 = auVar87._10_2_;
    uVar84 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar58 - (0xff < sVar13),
                      CONCAT14(cVar60,uVar83));
    sVar13 = auVar90._12_2_;
    cVar59 = (0 < sVar13) * (sVar13 < 0x100) * cVar57 - (0xff < sVar13);
    sVar13 = auVar99._14_2_;
    uVar85 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * cVar56 - (0xff < sVar13),
                      CONCAT16(cVar59,uVar84));
    cVar58 = (0 < sVar81) * (sVar81 < 0x100) * cVar6 - (0xff < sVar81);
    sVar13 = (short)((uint)uVar94 >> 0x10);
    auVar88._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * cVar7 - (0xff < sVar13),CONCAT18(cVar58,uVar85))
    ;
    sVar13 = (short)((uint6)uVar95 >> 0x20);
    cVar57 = (0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13);
    auVar88[10] = cVar57;
    sVar13 = (short)((ulong)uVar96 >> 0x30);
    auVar88[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar9 - (0xff < sVar13);
    sVar13 = (short)((unkuint10)auVar97._0_10_ >> 0x40);
    cVar56 = (0 < sVar13) * (sVar13 < 0x100) * cVar10 - (0xff < sVar13);
    auVar91[0xc] = cVar56;
    auVar91._0_12_ = auVar88;
    sVar13 = auVar97._10_2_;
    auVar91[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar11 - (0xff < sVar13);
    sVar13 = auVar98._12_2_;
    cVar62 = (0 < sVar13) * (sVar13 < 0x100) * cVar12 - (0xff < sVar13);
    auVar93[0xe] = cVar62;
    auVar93._0_14_ = auVar91;
    sVar13 = auVar101._14_2_;
    auVar93[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar64 - (0xff < sVar13);
    sVar13 = (short)((uint)uVar74 >> 0x10);
    sVar72 = (short)((uint6)uVar75 >> 0x20);
    sVar81 = (short)((ulong)uVar42 >> 0x30);
    sVar14 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
    sVar15 = auVar77._10_2_;
    sVar16 = auVar79._12_2_;
    sVar17 = auVar92._14_2_;
    sVar18 = (short)((uint)uVar83 >> 0x10);
    sVar19 = (short)((uint6)uVar84 >> 0x20);
    sVar20 = (short)((ulong)uVar85 >> 0x30);
    sVar21 = (short)((unkuint10)auVar88._0_10_ >> 0x40);
    sVar22 = auVar88._10_2_;
    sVar23 = auVar91._12_2_;
    sVar24 = auVar93._14_2_;
    acStack_328[lVar43 + -8] = ((0 < sVar73) * (sVar73 < 0x100) * cVar50 - (0xff < sVar73)) + '\x01'
    ;
    acStack_328[lVar43 + -7] = ((0 < sVar13) * (sVar13 < 0x100) * cVar5 - (0xff < sVar13)) + '\x01';
    acStack_328[lVar43 + -6] = ((0 < sVar72) * (sVar72 < 0x100) * cVar48 - (0xff < sVar72)) + '\x01'
    ;
    acStack_328[lVar43 + -5] = ((0 < sVar81) * (sVar81 < 0x100) * cVar55 - (0xff < sVar81)) + '\x01'
    ;
    acStack_328[lVar43 + -4] = ((0 < sVar14) * (sVar14 < 0x100) * cVar54 - (0xff < sVar14)) + '\x01'
    ;
    acStack_328[lVar43 + -3] = ((0 < sVar15) * (sVar15 < 0x100) * cVar53 - (0xff < sVar15)) + '\x01'
    ;
    acStack_328[lVar43 + -2] = ((0 < sVar16) * (sVar16 < 0x100) * cVar52 - (0xff < sVar16)) + '\x01'
    ;
    acStack_328[lVar43 + -1] = ((0 < sVar17) * (sVar17 < 0x100) * cVar51 - (0xff < sVar17)) + '\x01'
    ;
    acStack_328[lVar43] = ((0 < sVar82) * (sVar82 < 0x100) * cVar63 - (0xff < sVar82)) + '\x01';
    acStack_328[lVar43 + 1] = ((0 < sVar18) * (sVar18 < 0x100) * cVar61 - (0xff < sVar18)) + '\x01';
    acStack_328[lVar43 + 2] = ((0 < sVar19) * (sVar19 < 0x100) * cVar60 - (0xff < sVar19)) + '\x01';
    acStack_328[lVar43 + 3] = ((0 < sVar20) * (sVar20 < 0x100) * cVar59 - (0xff < sVar20)) + '\x01';
    acStack_328[lVar43 + 4] = ((0 < sVar21) * (sVar21 < 0x100) * cVar58 - (0xff < sVar21)) + '\x01';
    acStack_328[lVar43 + 5] = ((0 < sVar22) * (sVar22 < 0x100) * cVar57 - (0xff < sVar22)) + '\x01';
    acStack_328[lVar43 + 6] = ((0 < sVar23) * (sVar23 < 0x100) * cVar56 - (0xff < sVar23)) + '\x01';
    acStack_328[lVar43 + 7] = ((0 < sVar24) * (sVar24 < 0x100) * cVar62 - (0xff < sVar24)) + '\x01';
    lVar38 = auVar71._8_8_;
    auVar71._0_8_ = auVar71._0_8_ + 0x10;
    auVar71._8_8_ = lVar38 + 0x10;
    lVar38 = auVar70._8_8_;
    auVar70._0_8_ = auVar70._0_8_ + 0x10;
    auVar70._8_8_ = lVar38 + 0x10;
    lVar38 = auVar69._8_8_;
    auVar69._0_8_ = auVar69._0_8_ + 0x10;
    auVar69._8_8_ = lVar38 + 0x10;
    lVar38 = auVar68._8_8_;
    auVar68._0_8_ = auVar68._0_8_ + 0x10;
    auVar68._8_8_ = lVar38 + 0x10;
    lVar38 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 0x10;
    auVar67._8_8_ = lVar38 + 0x10;
    lVar38 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar38 + 0x10;
    lVar38 = auVar65._8_8_;
    auVar65._0_8_ = auVar65._0_8_ + 0x10;
    auVar65._8_8_ = lVar38 + 0x10;
    lVar38 = auVar49._8_8_;
    auVar49._0_8_ = auVar49._0_8_ + 0x10;
    auVar49._8_8_ = lVar38 + 0x10;
    lVar43 = lVar43 + 0x10;
  } while (lVar43 != 0x28);
  cVar48 = '\0';
  cVar50 = '\x01';
  cVar51 = '\x02';
  cVar52 = '\x03';
  cVar53 = '\x04';
  cVar54 = '\x05';
  cVar55 = '\x06';
  cVar56 = '\a';
  cVar57 = '\b';
  cVar58 = '\t';
  cVar59 = '\n';
  cVar60 = '\v';
  cVar61 = '\f';
  cVar62 = '\r';
  cVar63 = '\x0e';
  cVar64 = '\x0f';
  lVar43 = 0x28;
  do {
    acStack_328[lVar43 + -8] = cVar48 + DAT_001050c0;
    acStack_328[lVar43 + -7] = cVar50 + DAT_001050c0._1_1_;
    acStack_328[lVar43 + -6] = cVar51 + DAT_001050c0._2_1_;
    acStack_328[lVar43 + -5] = cVar52 + DAT_001050c0._3_1_;
    acStack_328[lVar43 + -4] = cVar53 + DAT_001050c0._4_1_;
    acStack_328[lVar43 + -3] = cVar54 + DAT_001050c0._5_1_;
    acStack_328[lVar43 + -2] = cVar55 + DAT_001050c0._6_1_;
    acStack_328[lVar43 + -1] = cVar56 + DAT_001050c0._7_1_;
    acStack_328[lVar43] = cVar57 + DAT_001050c0._8_1_;
    acStack_328[lVar43 + 1] = cVar58 + DAT_001050c0._9_1_;
    acStack_328[lVar43 + 2] = cVar59 + DAT_001050c0._10_1_;
    acStack_328[lVar43 + 3] = cVar60 + DAT_001050c0._11_1_;
    acStack_328[lVar43 + 4] = cVar61 + DAT_001050c0._12_1_;
    acStack_328[lVar43 + 5] = cVar62 + DAT_001050c0._13_1_;
    acStack_328[lVar43 + 6] = cVar63 + DAT_001050c0._14_1_;
    acStack_328[lVar43 + 7] = cVar64 + DAT_001050c0._15_1_;
    cVar48 = cVar48 + DAT_001050d0;
    cVar50 = cVar50 + DAT_001050d0._1_1_;
    cVar51 = cVar51 + DAT_001050d0._2_1_;
    cVar52 = cVar52 + DAT_001050d0._3_1_;
    cVar53 = cVar53 + DAT_001050d0._4_1_;
    cVar54 = cVar54 + DAT_001050d0._5_1_;
    cVar55 = cVar55 + DAT_001050d0._6_1_;
    cVar56 = cVar56 + DAT_001050d0._7_1_;
    cVar57 = cVar57 + DAT_001050d0._8_1_;
    cVar58 = cVar58 + DAT_001050d0._9_1_;
    cVar59 = cVar59 + DAT_001050d0._10_1_;
    cVar60 = cVar60 + DAT_001050d0._11_1_;
    cVar61 = cVar61 + DAT_001050d0._12_1_;
    cVar62 = cVar62 + DAT_001050d0._13_1_;
    cVar63 = cVar63 + DAT_001050d0._14_1_;
    cVar64 = cVar64 + DAT_001050d0._15_1_;
    lVar43 = lVar43 + 0x10;
  } while (lVar43 != 0x48);
  uStack_2a0 = 0x48;
  uVar42 = 0;
  iVar26 = secp256k1_ecdsa_sign(uStack_330,auStack_200,acStack_328,auStack_308,0);
  if (iVar26 == 0) {
LAB_00103a6c:
    main_cold_10();
LAB_00103a71:
    main_cold_9();
  }
  else {
    iVar26 = secp256k1_ecdsa_signature_serialize_der(uStack_330,auStack_2e8,&uStack_2a0,auStack_200)
    ;
    if (iVar26 == 0) goto LAB_00103a71;
    iVar26 = secp256k1_ec_pubkey_create(uStack_330,auStack_1c0,auStack_308);
    if (iVar26 != 0) {
      uStack_270 = 0x21;
      iVar26 = secp256k1_ec_pubkey_serialize(uStack_330,auStack_298,&uStack_270,auStack_1c0,0x102);
      if (iVar26 != 1) goto LAB_00103a7b;
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      iVar26 = (int)uVar30;
      if (argc == 1) {
LAB_001034c3:
        run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr_int *)&uStack_330,(void *)(uVar30 & 0xffffffff),
                      (int)uVar42,in_stack_fffffffffffffc48);
      }
      else {
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_00103469;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ecdsa");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_001034c3;
LAB_00103469:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_00103496;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"verify");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_001034c3;
LAB_00103496:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_001034e3;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ecdsa_verify");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_001034c3;
      }
LAB_001034e3:
      if (argc == 1) {
LAB_00103573:
        run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,
                      (_func_void_void_ptr_int *)&uStack_330,(void *)(uVar30 & 0xffffffff),
                      (int)uVar42,in_stack_fffffffffffffc48);
      }
      else {
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_00103519;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ecdsa");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103573;
LAB_00103519:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_00103546;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"sign");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103573;
LAB_00103546:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_00103598;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ecdsa_sign");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103573;
      }
LAB_00103598:
      if (argc == 1) {
LAB_00103628:
        run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                      (_func_void_void_ptr_int *)&uStack_330,(void *)(uVar30 & 0xffffffff),
                      (int)uVar42,in_stack_fffffffffffffc48);
      }
      else {
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_001035ce;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ec");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103628;
LAB_001035ce:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_001035fb;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"keygen");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103628;
LAB_001035fb:
        lVar43 = 8;
        do {
          lVar38 = lVar43;
          if (lVar39 - lVar38 == 0) goto LAB_0010364d;
          iVar27 = strcmp(*(char **)((long)argv + lVar38),"ec_keygen");
          lVar43 = lVar38 + 8;
        } while (iVar27 != 0);
        if (lVar39 - lVar38 != 0) goto LAB_00103628;
      }
LAB_0010364d:
      secp256k1_context_destroy(uStack_330);
      auStack_268[0] = secp256k1_context_create(1);
      if (argc != 1) {
        lVar43 = 8;
        do {
          if (lVar39 - lVar43 == 0) goto LAB_001036bc;
          iVar27 = strcmp(*(char **)((long)argv + lVar43),"ecdh");
          lVar43 = lVar43 + 8;
        } while (iVar27 != 0);
      }
      run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)auStack_268,
                    (void *)(uVar30 & 0xffffffff),(int)uVar42,in_stack_fffffffffffffc48);
LAB_001036bc:
      lStack_360 = lVar39;
      secp256k1_context_destroy(auStack_268[0]);
      auStack_390[0] = secp256k1_context_create(1);
      __size = (long)iVar26 << 3;
      pvStack_380 = malloc(__size);
      pvStack_378 = malloc(__size);
      pvStack_368 = malloc(__size);
      pvStack_370 = malloc(__size);
      if (0 < iVar26) {
        uVar44 = 0;
        do {
          puVar31 = (undefined1 *)malloc(0x20);
          pvVar32 = malloc(0x40);
          pvVar33 = malloc(0x60);
          pvVar34 = malloc(0x20);
          uStack_358 = (undefined1)uVar44;
          *puVar31 = uStack_358;
          uStack_357 = (undefined1)(uVar44 >> 8);
          puVar31[1] = uStack_357;
          uStack_356 = (undefined1)(uVar44 >> 0x10);
          puVar31[2] = uStack_356;
          uStack_355 = (undefined1)(uVar44 >> 0x18);
          puVar31[3] = uStack_355;
          *(undefined8 *)(puVar31 + 4) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar31 + 0xc) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar31 + 0x10) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar31 + 0x18) = 0x6d6d6d6d6d6d6d6d;
          uStack_344 = 0x73737373;
          uStack_340 = 0x7373737373737373;
          uStack_354 = 0x7373737373737373;
          uStack_34c = 0x73737373;
          uStack_348 = 0x73737373;
          *(void **)((long)pvStack_380 + uVar44 * 8) = pvVar33;
          *(void **)((long)pvStack_378 + uVar44 * 8) = pvVar34;
          *(undefined1 **)((long)pvStack_368 + uVar44 * 8) = puVar31;
          *(void **)((long)pvStack_370 + uVar44 * 8) = pvVar32;
          iVar27 = secp256k1_keypair_create(auStack_390[0],pvVar33,&uStack_358);
          if (iVar27 == 0) {
            main_cold_7();
LAB_00103a5d:
            main_cold_6();
LAB_00103a62:
            main_cold_5();
LAB_00103a67:
            main_cold_4();
            goto LAB_00103a6c;
          }
          uVar42 = 0;
          iVar27 = secp256k1_schnorrsig_sign_custom(auStack_390[0],pvVar32,puVar31,0x20,pvVar33);
          if (iVar27 == 0) goto LAB_00103a5d;
          iVar27 = secp256k1_keypair_xonly_pub(auStack_390[0],auStack_268,0,pvVar33);
          if (iVar27 == 0) goto LAB_00103a62;
          iVar27 = secp256k1_xonly_pubkey_serialize(auStack_390[0],pvVar34,auStack_268);
          if (iVar27 != 1) goto LAB_00103a67;
          uVar44 = uVar44 + 1;
        } while ((uVar30 & 0xffffffff) != uVar44);
      }
      lVar39 = lStack_360;
      if (argc != 1) {
        lVar43 = 8;
        do {
          if (lVar39 == lVar43) {
            lVar43 = 8;
            goto LAB_001038b0;
          }
          iVar27 = strcmp(*(char **)((long)argv + lVar43),"schnorrsig");
          lVar43 = lVar43 + 8;
        } while (iVar27 != 0);
      }
      goto LAB_001038f1;
    }
  }
  main_cold_8();
LAB_00103a7b:
  main_cold_3();
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  puts("    - ElligatorSwift (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  putchar(10);
  return;
  while( true ) {
    iVar27 = strcmp(*(char **)((long)argv + lVar43),"sign");
    lVar43 = lVar43 + 8;
    if (iVar27 == 0) break;
LAB_001038b0:
    if (lVar39 == lVar43) {
      lVar43 = 8;
      goto LAB_001038d8;
    }
  }
  goto LAB_001038f1;
  while( true ) {
    iVar28 = strcmp(*(char **)((long)argv + lVar43),"verify");
    iVar27 = (int)uVar42;
    lVar43 = lVar43 + 8;
    if (iVar28 == 0) break;
LAB_00103948:
    if (lVar39 == lVar43) {
      lVar43 = 8;
      goto LAB_00103970;
    }
  }
  goto LAB_00103989;
  while( true ) {
    iVar28 = strcmp(*(char **)((long)argv + lVar43),"schnorrsig_verify");
    iVar27 = (int)uVar42;
    lVar43 = lVar43 + 8;
    if (iVar28 == 0) break;
LAB_00103970:
    if (lVar39 == lVar43) goto LAB_001039a6;
  }
  goto LAB_00103989;
  while( true ) {
    iVar27 = strcmp(*(char **)((long)argv + lVar43),"schnorrsig_sign");
    lVar43 = lVar43 + 8;
    if (iVar27 == 0) break;
LAB_001038d8:
    if (lVar39 == lVar43) goto LAB_0010390e;
  }
LAB_001038f1:
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_390,(void *)(uVar30 & 0xffffffff),(int)uVar42,
                in_stack_fffffffffffffc48);
LAB_0010390e:
  iVar27 = (int)uVar42;
  if (argc != 1) {
    lVar43 = 8;
    do {
      if (lVar39 == lVar43) {
        lVar43 = 8;
        goto LAB_00103948;
      }
      iVar28 = strcmp(*(char **)((long)argv + lVar43),"schnorrsig");
      iVar27 = (int)uVar42;
      lVar43 = lVar43 + 8;
    } while (iVar28 != 0);
  }
LAB_00103989:
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_390,(void *)(uVar30 & 0xffffffff),iVar27,
                in_stack_fffffffffffffc48);
LAB_001039a6:
  if (0 < iVar26) {
    uVar44 = 0;
    do {
      free(*(void **)((long)pvStack_380 + uVar44 * 8));
      free(*(void **)((long)pvStack_378 + uVar44 * 8));
      free(*(void **)((long)pvStack_368 + uVar44 * 8));
      free(*(void **)((long)pvStack_370 + uVar44 * 8));
      uVar44 = uVar44 + 1;
    } while ((uVar30 & 0xffffffff) != uVar44);
  }
  free(pvStack_380);
  free(pvStack_378);
  free(pvStack_368);
  free(pvStack_370);
  secp256k1_context_destroy(auStack_390[0]);
  run_ellswift_bench(iVar26,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_setup(void *arg) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;
    static const unsigned char init[64] = {
        0x78, 0x1f, 0xb7, 0xd4, 0x67, 0x7f, 0x08, 0x68,
        0xdb, 0xe3, 0x1d, 0x7f, 0x1b, 0xb0, 0xf6, 0x9e,
        0x0a, 0x64, 0xca, 0x32, 0x9e, 0xc6, 0x20, 0x79,
        0x03, 0xf3, 0xd0, 0x46, 0x7a, 0x0f, 0xd2, 0x21,
        0xb0, 0x2c, 0x46, 0xd8, 0xba, 0xca, 0x26, 0x4f,
        0x8f, 0x8c, 0xd4, 0xdd, 0x2d, 0x04, 0xbe, 0x30,
        0x48, 0x51, 0x1e, 0xd4, 0x16, 0xfd, 0x42, 0x85,
        0x62, 0xc9, 0x02, 0xf9, 0x89, 0x84, 0xff, 0xdc
    };
    memcpy(data->rnd64, init, 64);
    for (i = 0; i < 256; ++i) {
        int j;
        CHECK(secp256k1_ellswift_decode(data->ctx, &data->point[i], data->rnd64));
        for (j = 0; j < 64; ++j) {
            data->rnd64[j] += 1;
        }
    }
    CHECK(secp256k1_ellswift_encode(data->ctx, data->rnd64, &data->point[255], init + 16));
}